

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type * __thiscall
FadBinaryAdd<Fad<Fad<double>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>::dx
          (value_type *__return_storage_ptr__,
          FadBinaryAdd<Fad<Fad<double>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
          *this,int i)

{
  uint uVar1;
  Fad<Fad<double>_> *pFVar2;
  uint uVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  double *pdVar7;
  double *pdVar8;
  Fad<double> *pFVar9;
  value_type local_40;
  
  pFVar2 = this->left_;
  pFVar9 = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    pFVar9 = (pFVar2->dx_).ptr_to_data + i;
  }
  FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::dx(&local_40,&this->right_->fadexpr_,i);
  __return_storage_ptr__->val_ = pFVar9->val_ + local_40.val_;
  uVar1 = (pFVar9->dx_).num_elts;
  if ((int)uVar1 <= local_40.dx_.num_elts) {
    uVar1 = local_40.dx_.num_elts;
  }
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if ((int)uVar1 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = uVar1;
    pdVar4 = (double *)operator_new__((ulong)uVar1 << 3);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar4;
    uVar1 = (pFVar9->dx_).num_elts;
    uVar3 = local_40.dx_.num_elts;
    if (local_40.dx_.num_elts < (int)uVar1) {
      uVar3 = uVar1;
    }
    __return_storage_ptr__->defaultVal = 0.0;
    if (0 < (int)uVar3) {
      pdVar5 = (pFVar9->dx_).ptr_to_data;
      uVar6 = 0;
      do {
        pdVar7 = pdVar5;
        if (uVar1 == 0) {
          pdVar7 = &pFVar9->defaultVal;
        }
        pdVar8 = local_40.dx_.ptr_to_data;
        if (local_40.dx_.num_elts == 0) {
          pdVar8 = &local_40.defaultVal;
        }
        pdVar4[uVar6] = *pdVar7 + *pdVar8;
        uVar6 = uVar6 + 1;
        local_40.dx_.ptr_to_data = local_40.dx_.ptr_to_data + 1;
        pdVar5 = pdVar5 + 1;
      } while (uVar3 != uVar6);
    }
  }
  Fad<double>::~Fad(&local_40);
  return __return_storage_ptr__;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) + right_.dx(i);}